

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BlitDefaultFramebufferCase::preCheck(BlitDefaultFramebufferCase *this)

{
  int iVar1;
  RenderTarget *this_00;
  NotSupportedError *this_01;
  allocator<char> local_31;
  string local_30;
  BlitDefaultFramebufferCase *local_10;
  BlitDefaultFramebufferCase *this_local;
  
  local_10 = this;
  this_00 = gles3::Context::getRenderTarget((this->super_FboTestCase).super_TestCase.m_context);
  iVar1 = tcu::RenderTarget::getNumSamples(this_00);
  if (0 < iVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Not supported in MSAA config",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_30);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  FboTestCase::checkFormatSupport(&this->super_FboTestCase,this->m_format);
  return;
}

Assistant:

void preCheck (void)
	{
		if (m_context.getRenderTarget().getNumSamples() > 0)
			throw tcu::NotSupportedError("Not supported in MSAA config");

		checkFormatSupport(m_format);
	}